

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

int tmove(lua_State *L)

{
  int iVar1;
  lua_Integer n;
  lua_Integer n_00;
  lua_Integer n_01;
  long lVar2;
  int arg;
  
  n = luaL_checkinteger(L,2);
  n_00 = luaL_checkinteger(L,3);
  n_01 = luaL_checkinteger(L,4);
  iVar1 = lua_type(L,5);
  arg = (uint)(0 < iVar1) * 4 + 1;
  checktab(L,1,1);
  checktab(L,arg,2);
  lVar2 = n_00 - n;
  if (n <= n_00) {
    if (n + 0x7fffffffffffffff <= n_00 && n < 1) {
      luaL_argerror(L,3,"too many elements to move");
    }
    if (0x7fffffffffffffff - lVar2 < n_01) {
      luaL_argerror(L,4,"destination wrap around");
    }
    if (((n_01 - n == 0 || n_01 < n) || n_00 < n_01) ||
       ((0 < iVar1 && (iVar1 = lua_compare(L,1,5,0), iVar1 == 0)))) {
      if (-1 < lVar2) {
        do {
          lua_geti(L,1,n);
          lua_seti(L,arg,n_01);
          n = n + 1;
          n_01 = n_01 + 1;
        } while (n_00 + 1 != n);
      }
    }
    else if (-1 < lVar2) {
      do {
        lua_geti(L,1,n_00);
        lua_seti(L,arg,n_00 + (n_01 - n));
        n_00 = n_00 + -1;
      } while (n + -1 != n_00);
    }
  }
  lua_pushvalue(L,arg);
  return 1;
}

Assistant:

static int tmove(lua_State *L) {
    lua_Integer f = luaL_checkinteger(L, 2);
    lua_Integer e = luaL_checkinteger(L, 3);
    lua_Integer t = luaL_checkinteger(L, 4);
    int tt = !lua_isnoneornil(L, 5) ? 5 : 1;  /* destination table */
    checktab(L, 1, TAB_R);
    checktab(L, tt, TAB_W);
    if (e >= f) {  /* otherwise, nothing to move */
        lua_Integer n, i;
        luaL_argcheck(L, f > 0 || e < LUA_MAXINTEGER + f, 3,
                      "too many elements to move");
        n = e - f + 1;  /* number of elements to move */
        luaL_argcheck(L, t <= LUA_MAXINTEGER - n + 1, 4,
                      "destination wrap around");
        if (t > e || t <= f || (tt != 1 && !lua_compare(L, 1, tt, LUA_OPEQ))) {
            for (i = 0; i < n; i++) {
                lua_geti(L, 1, f + i);
                lua_seti(L, tt, t + i);
            }
        } else {
            for (i = n - 1; i >= 0; i--) {
                lua_geti(L, 1, f + i);
                lua_seti(L, tt, t + i);
            }
        }
    }
    lua_pushvalue(L, tt);  /* return destination table */
    return 1;
}